

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::Incomplete2DMissingLevelCase::createTexture
          (Incomplete2DMissingLevelCase *this)

{
  int iVar1;
  int iVar2;
  int height;
  GLenum err;
  int *piVar3;
  void *pixels;
  PixelBufferAccess local_c8;
  int local_a0;
  int local_9c;
  int levelH;
  int levelW;
  PixelBufferAccess local_88;
  int local_5c;
  int local_58;
  int levelNdx;
  int numLevels;
  GLuint local_44;
  undefined1 local_40 [4];
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  Incomplete2DMissingLevelCase *this_local;
  
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_40,(TextureFormat *)&levelData.m_data.m_cap)
  ;
  glwGenTextures(1,&local_44);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,local_44);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  piVar3 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = ::deLog2Floor32(*piVar3);
  piVar3 = tcu::Vector<int,_2>::y(&this->m_size);
  iVar2 = ::deLog2Floor32(*piVar3);
  local_58 = de::max<int>(iVar1,iVar2);
  local_58 = local_58 + 1;
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    piVar3 = tcu::Vector<int,_2>::x(&this->m_size);
    iVar1 = *piVar3;
    piVar3 = tcu::Vector<int,_2>::y(&this->m_size);
    tcu::TextureLevel::setSize((TextureLevel *)local_40,iVar1,*piVar3,1);
    tcu::TextureLevel::getAccess(&local_88,(TextureLevel *)local_40);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelH,0.0,0.0,1.0,1.0);
    tcu::clear(&local_88,(Vec4 *)&levelH);
    piVar3 = tcu::Vector<int,_2>::x(&this->m_size);
    local_9c = de::max<int>(1,*piVar3 >> ((byte)local_5c & 0x1f));
    piVar3 = tcu::Vector<int,_2>::y(&this->m_size);
    height = de::max<int>(1,*piVar3 >> ((byte)local_5c & 0x1f));
    iVar2 = local_5c;
    iVar1 = local_9c;
    local_a0 = height;
    if (local_5c != *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
      tcu::TextureLevel::getAccess(&local_c8,(TextureLevel *)local_40);
      pixels = tcu::PixelBufferAccess::getDataPtr(&local_c8);
      glwTexImage2D(0xde1,iVar2,0x1908,iVar1,height,0,0x1908,0x1401,pixels);
    }
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x1a3);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_40);
  return;
}

Assistant:

void Incomplete2DMissingLevelCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		// Skip specified level.
		if (levelNdx != m_missingLevelNdx)
			glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");
}